

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_getinteger(HSQUIRRELVM v,SQInteger idx,SQInteger *i)

{
  bool bVar1;
  SQObjectPtr *o_00;
  SQObjectValue SVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  SQObjectPtr *o;
  SQInteger in_stack_ffffffffffffffc8;
  HSQUIRRELVM in_stack_ffffffffffffffd0;
  SQRESULT local_8;
  
  o_00 = stack_get(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (((o_00->super_SQObject)._type & 0x4000000) == 0) {
    if ((o_00->super_SQObject)._type == OT_BOOL) {
      bVar1 = SQVM::IsFalse(o_00);
      *(SQObjectValue *)CONCAT71(in_register_00000011,in_DL) =
           (SQObjectValue)(long)(int)(uint)!bVar1;
      local_8 = 0;
    }
    else {
      local_8 = -1;
    }
  }
  else {
    if ((o_00->super_SQObject)._type == OT_FLOAT) {
      SVar2.nInteger = (SQInteger)(o_00->super_SQObject)._unVal.fFloat;
    }
    else {
      SVar2 = (o_00->super_SQObject)._unVal;
    }
    ((SQObjectValue *)CONCAT71(in_register_00000011,in_DL))->nInteger = (SQInteger)SVar2;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQRESULT sq_getinteger(HSQUIRRELVM v,SQInteger idx,SQInteger *i)
{
    SQObjectPtr &o = stack_get(v, idx);
    if(sq_isnumeric(o)) {
        *i = tointeger(o);
        return SQ_OK;
    }
    if(sq_isbool(o)) {
        *i = SQVM::IsFalse(o)?SQFalse:SQTrue;
        return SQ_OK;
    }
    return SQ_ERROR;
}